

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_seg_normal(REF_NODE ref_node,REF_INT *nodes,REF_DBL *normal)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) && (-1 < ref_node->global[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < ref_node->max && -1 < (int)uVar3) && (-1 < ref_node->global[uVar3])) {
      pRVar2 = ref_node->real;
      *normal = pRVar2[(ulong)(uVar3 * 0xf) + 1] - pRVar2[(ulong)(uint)(iVar1 * 0xf) + 1];
      normal[1] = pRVar2[(uint)(iVar1 * 0xf)] - pRVar2[uVar3 * 0xf];
      normal[2] = 0.0;
      uVar3 = ref_math_normalize(normal);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar6 = "normalize";
      uVar4 = 0x8cb;
      uVar5 = (ulong)uVar3;
      goto LAB_001348ab;
    }
  }
  pcVar6 = "node invalid";
  uVar3 = 3;
  uVar4 = 0x8c2;
  uVar5 = 3;
LAB_001348ab:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_seg_normal",uVar5,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_seg_normal(REF_NODE ref_node, REF_INT *nodes,
                                       REF_DBL *normal) {
  REF_DBL *xyz0, *xyz1;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);

  normal[0] = xyz1[1] - xyz0[1];
  normal[1] = xyz0[0] - xyz1[0];
  normal[2] = 0.0;

  RSS(ref_math_normalize(normal), "normalize");

  return REF_SUCCESS;
}